

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O3

robin_hash<std::pair<unsigned_long,_ImputedData<int,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<int,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<int,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<int,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<int,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<int,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
* __thiscall
tsl::detail_robin_hash::
robin_hash<std::pair<unsigned_long,_ImputedData<int,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<int,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<int,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<int,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<int,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<int,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
::operator=(robin_hash<std::pair<unsigned_long,_ImputedData<int,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<int,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<int,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<int,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<int,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<int,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
            *this,robin_hash<std::pair<unsigned_long,_ImputedData<int,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<int,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<int,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<int,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<int,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<int,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                  *other)

{
  bucket_entry *pbVar1;
  
  swap(other,this);
  (other->super_power_of_two_growth_policy<2UL>).m_mask = 0;
  std::
  vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<int,_double>_>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<int,_double>_>,_false>_>_>
  ::clear(&other->m_buckets_data);
  pbVar1 = static_empty_bucket_ptr(other);
  other->m_buckets = pbVar1;
  other->m_grow_on_next_insert = false;
  other->m_try_shrink_on_next_insert = false;
  other->m_bucket_count = 0;
  other->m_nb_elements = 0;
  other->m_load_threshold = 0;
  return this;
}

Assistant:

robin_hash& operator=(robin_hash&& other) {
    other.swap(*this);
    other.clear_and_shrink();

    return *this;
  }